

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MaterialSystem.cpp
# Opt level: O0

aiReturn __thiscall
aiMaterial::AddBinaryProperty
          (aiMaterial *this,void *pInput,uint pSizeInBytes,char *pKey,uint type,uint index,
          aiPropertyTypeInfo pType)

{
  uint uVar1;
  int iVar2;
  aiMaterialProperty *paVar3;
  char *pcVar4;
  size_t sVar5;
  aiMaterialProperty **__dest;
  bad_alloc *anon_var_0;
  aiMaterialProperty **ppTemp;
  uint iOld;
  aiMaterialProperty *pcNew;
  aiMaterialProperty *prop;
  uint i;
  uint iOutIndex;
  uint index_local;
  uint type_local;
  char *pKey_local;
  uint pSizeInBytes_local;
  void *pInput_local;
  aiMaterial *this_local;
  
  if (pInput == (void *)0x0) {
    __assert_fail("pInput != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Material/MaterialSystem.cpp"
                  ,0x1da,
                  "aiReturn aiMaterial::AddBinaryProperty(const void *, unsigned int, const char *, unsigned int, unsigned int, aiPropertyTypeInfo)"
                 );
  }
  if (pKey != (char *)0x0) {
    if (pSizeInBytes == 0) {
      __assert_fail("0 != pSizeInBytes",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Material/MaterialSystem.cpp"
                    ,0x1dc,
                    "aiReturn aiMaterial::AddBinaryProperty(const void *, unsigned int, const char *, unsigned int, unsigned int, aiPropertyTypeInfo)"
                   );
    }
    if (pSizeInBytes == 0) {
      this_local._4_4_ = aiReturn_FAILURE;
    }
    else {
      prop._4_4_ = 0xffffffff;
      for (prop._0_4_ = 0; (uint)prop < this->mNumProperties; prop._0_4_ = (uint)prop + 1) {
        paVar3 = this->mProperties[(uint)prop];
        if (paVar3 != (aiMaterialProperty *)0x0) {
          iVar2 = strcmp((paVar3->mKey).data,pKey);
          if (((iVar2 == 0) && (paVar3->mSemantic == type)) && (paVar3->mIndex == index)) {
            paVar3 = this->mProperties[(uint)prop];
            if (paVar3 != (aiMaterialProperty *)0x0) {
              aiMaterialProperty::~aiMaterialProperty(paVar3);
              operator_delete(paVar3,0x420);
            }
            prop._4_4_ = (uint)prop;
          }
        }
      }
      paVar3 = (aiMaterialProperty *)operator_new(0x420);
      aiMaterialProperty::aiMaterialProperty(paVar3);
      paVar3->mType = pType;
      paVar3->mSemantic = type;
      paVar3->mIndex = index;
      paVar3->mDataLength = pSizeInBytes;
      pcVar4 = (char *)operator_new__((ulong)pSizeInBytes);
      paVar3->mData = pcVar4;
      memcpy(paVar3->mData,pInput,(ulong)pSizeInBytes);
      sVar5 = strlen(pKey);
      (paVar3->mKey).length = (ai_uint32)sVar5;
      if (0x3ff < (paVar3->mKey).length) {
        __assert_fail("MAXLEN > pcNew->mKey.length",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Material/MaterialSystem.cpp"
                      ,0x1fc,
                      "aiReturn aiMaterial::AddBinaryProperty(const void *, unsigned int, const char *, unsigned int, unsigned int, aiPropertyTypeInfo)"
                     );
      }
      strcpy((paVar3->mKey).data,pKey);
      if (prop._4_4_ == 0xffffffff) {
        if (this->mNumProperties == this->mNumAllocated) {
          uVar1 = this->mNumAllocated;
          this->mNumAllocated = this->mNumAllocated * 2;
          __dest = (aiMaterialProperty **)operator_new__((ulong)this->mNumAllocated << 3);
          memcpy(__dest,this->mProperties,(ulong)uVar1 << 3);
          if (this->mProperties != (aiMaterialProperty **)0x0) {
            operator_delete__(this->mProperties);
          }
          this->mProperties = __dest;
        }
        uVar1 = this->mNumProperties;
        this->mNumProperties = uVar1 + 1;
        this->mProperties[uVar1] = paVar3;
        this_local._4_4_ = aiReturn_SUCCESS;
      }
      else {
        this->mProperties[prop._4_4_] = paVar3;
        this_local._4_4_ = aiReturn_SUCCESS;
      }
    }
    return this_local._4_4_;
  }
  __assert_fail("pKey != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Material/MaterialSystem.cpp"
                ,0x1db,
                "aiReturn aiMaterial::AddBinaryProperty(const void *, unsigned int, const char *, unsigned int, unsigned int, aiPropertyTypeInfo)"
               );
}

Assistant:

aiReturn aiMaterial::AddBinaryProperty (const void* pInput,
    unsigned int pSizeInBytes,
    const char* pKey,
    unsigned int type,
    unsigned int index,
    aiPropertyTypeInfo pType
    )
{
    ai_assert( pInput != nullptr );
	ai_assert(pKey != nullptr );
    ai_assert( 0 != pSizeInBytes );

    if ( 0 == pSizeInBytes ) {
		return AI_FAILURE;
    }

    // first search the list whether there is already an entry with this key
    unsigned int iOutIndex( UINT_MAX );
    for ( unsigned int i = 0; i < mNumProperties; ++i ) {
        aiMaterialProperty *prop( mProperties[ i ] );

        if (prop /* just for safety */ && !strcmp( prop->mKey.data, pKey ) &&
            prop->mSemantic == type && prop->mIndex == index){

            delete mProperties[i];
            iOutIndex = i;
        }
    }

    // Allocate a new material property
    aiMaterialProperty* pcNew = new aiMaterialProperty();

    // .. and fill it
    pcNew->mType = pType;
    pcNew->mSemantic = type;
    pcNew->mIndex = index;

    pcNew->mDataLength = pSizeInBytes;
    pcNew->mData = new char[pSizeInBytes];
    memcpy (pcNew->mData,pInput,pSizeInBytes);

    pcNew->mKey.length = ::strlen(pKey);
    ai_assert ( MAXLEN > pcNew->mKey.length);
    strcpy( pcNew->mKey.data, pKey );

    if (UINT_MAX != iOutIndex)  {
        mProperties[iOutIndex] = pcNew;
        return AI_SUCCESS;
    }

    // resize the array ... double the storage allocated
    if (mNumProperties == mNumAllocated)    {
        const unsigned int iOld = mNumAllocated;
        mNumAllocated *= 2;

        aiMaterialProperty** ppTemp;
        try {
            ppTemp = new aiMaterialProperty*[mNumAllocated];
        } catch (std::bad_alloc&) {
            delete pcNew;
            return AI_OUTOFMEMORY;
        }

        // just copy all items over; then replace the old array
        memcpy (ppTemp,mProperties,iOld * sizeof(void*));

        delete[] mProperties;
        mProperties = ppTemp;
    }
    // push back ...
    mProperties[mNumProperties++] = pcNew;

    return AI_SUCCESS;
}